

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::UpdateTxOutAmountData::ConvertFromStruct
          (UpdateTxOutAmountData *this,UpdateTxOutAmountDataStruct *data)

{
  UpdateTxOutAmountDataStruct *data_local;
  UpdateTxOutAmountData *this_local;
  
  this->amount_ = data->amount;
  this->index_ = data->index;
  std::__cxx11::string::operator=((string *)&this->address_,(string *)&data->address);
  std::__cxx11::string::operator=
            ((string *)&this->direct_locking_script_,(string *)&data->direct_locking_script);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void UpdateTxOutAmountData::ConvertFromStruct(
    const UpdateTxOutAmountDataStruct& data) {
  amount_ = data.amount;
  index_ = data.index;
  address_ = data.address;
  direct_locking_script_ = data.direct_locking_script;
  ignore_items = data.ignore_items;
}